

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellReissner4::SetLayerZreference
          (ChElementShellReissner4 *this,double z_from_bottom)

{
  pointer pdVar1;
  iterator iVar2;
  double *pdVar3;
  pointer pLVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double local_40;
  double local_38;
  
  this->tot_thickness = 0.0;
  pLVar4 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->m_layers).
                super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar4;
  if (lVar5 != 0) {
    dVar7 = this->tot_thickness;
    lVar5 = (lVar5 >> 3) * -0x3333333333333333;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    pdVar3 = &pLVar4->m_thickness;
    do {
      dVar7 = dVar7 + *pdVar3;
      pdVar3 = pdVar3 + 5;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    this->tot_thickness = dVar7;
  }
  pdVar1 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  iVar2._M_current =
       (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = z_from_bottom;
  if (iVar2._M_current ==
      (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->m_layers_z,iVar2,&local_38);
  }
  else {
    *iVar2._M_current = z_from_bottom;
    (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pLVar4 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_layers).
      super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar4) {
    lVar5 = 3;
    uVar6 = 0;
    do {
      local_40 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6] + (double)(&pLVar4->m_element)[lVar5];
      iVar2._M_current =
           (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->m_layers_z,iVar2,&local_40);
      }
      else {
        *iVar2._M_current = local_40;
        (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      uVar6 = uVar6 + 1;
      pLVar4 = (this->m_layers).
               super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 5;
    } while (uVar6 < (ulong)(((long)(this->m_layers).
                                    super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar4 >> 3)
                            * -0x3333333333333333));
  }
  return;
}

Assistant:

void ChElementShellReissner4::SetLayerZreference(double z_from_bottom) {
    // accumulate element thickness.
    tot_thickness = 0;
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        tot_thickness += m_layers[kl].Get_thickness();
    }

    // Loop again over the layers and calculate the z levels of layers, by centering them
    m_layers_z.clear();
    m_layers_z.push_back(z_from_bottom);
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        m_layers_z.push_back(m_layers_z[kl] + m_layers[kl].Get_thickness());
    }
}